

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

Vec3fa __thiscall embree::ParseStream::getVec3fa(ParseStream *this)

{
  double dVar1;
  double dVar2;
  char *pcVar3;
  undefined8 *in_RDI;
  Vec3fa VVar4;
  float z;
  float y;
  float x;
  string local_c8 [40];
  string local_a0 [36];
  float local_7c;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (in_stack_ffffffffffffff88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (in_stack_ffffffffffffff88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar3);
  std::__cxx11::string::~string(local_a0);
  local_7c = (float)dVar2;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (in_stack_ffffffffffffff88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar3);
  std::__cxx11::string::~string(local_c8);
  *in_RDI = CONCAT44(local_7c,(float)dVar1);
  in_RDI[1] = (ulong)(uint)(float)dVar2;
  VVar4.field_0.m128[2] = (float)dVar2;
  VVar4.field_0._0_8_ = CONCAT44(local_7c,(float)dVar1);
  VVar4.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

Vec3fa getVec3fa() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3fa(x,y,z);
    }